

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O2

int capnp::_::OrphanBuilder::copy(EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  void *in_RCX;
  undefined8 in_RDX;
  long in_R8;
  unsigned_long value;
  AllocateResult AVar1;
  
  *(undefined8 *)(dst + 0x10) = 0;
  *(undefined8 *)(dst + 0x18) = 0;
  *(undefined8 *)dst = 0;
  *(undefined8 *)(dst + 8) = 0;
  value = in_R8 - 1;
  assertMax<536870910u,unsigned_long,capnp::_::WireHelpers::setTextPointer(capnp::_::WirePointer*,capnp::_::SegmentBuilder*,capnp::_::CapTableBuilder*,capnp::Text::Reader,capnp::_::BuilderArena*)::_lambda()_1_>
            (value,(anon_class_1_0_00000001 *)src);
  AVar1 = BuilderArena::allocate((BuilderArena *)src,(int)value + 8U >> 3);
  *(undefined4 *)dst = 0xfffffffd;
  *(int *)(dst + 4) = (int)value * 8 + 10;
  if (value != 0) {
    memcpy(AVar1.words,in_RCX,value);
  }
  *(SegmentBuilder **)(dst + 8) = AVar1.segment;
  *(undefined8 *)(dst + 0x10) = in_RDX;
  *(word **)(dst + 0x18) = AVar1.words;
  return (int)dst;
}

Assistant:

OrphanBuilder OrphanBuilder::copy(
    BuilderArena* arena, CapTableBuilder* capTable, Text::Reader copyFrom) {
  OrphanBuilder result;
  auto allocation = WireHelpers::setTextPointer(
      result.tagAsPtr(), nullptr, capTable, copyFrom, arena);
  result.segment = allocation.segment;
  result.capTable = capTable;
  result.location = reinterpret_cast<word*>(allocation.value.begin());
  return result;
}